

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Facet.hpp
# Opt level: O0

bool __thiscall
Parfait::Facet::triBoxOverlap
          (Facet *this,Point<double> *boxcenter,Point<double> *boxhalfsize,
          array<Parfait::Point<double>,_3UL> *triverts)

{
  double b;
  bool bVar1;
  const_reference pvVar2;
  double *pdVar3;
  double dVar4;
  pair<double,_double> pVar5;
  undefined1 local_128 [8];
  Point<double> normal;
  pair<double,_double> local_100;
  double local_f0;
  double max;
  double min;
  double dStack_d8;
  int i;
  double fez;
  double fey;
  double fex;
  Point<double> e2;
  Point<double> e1;
  Point<double> e0;
  Point<double> v2;
  Point<double> v1;
  Point<double> v0;
  array<Parfait::Point<double>,_3UL> *triverts_local;
  Point<double> *boxhalfsize_local;
  Point<double> *boxcenter_local;
  Facet *this_local;
  
  pvVar2 = std::array<Parfait::Point<double>,_3UL>::operator[](triverts,0);
  Point<double>::operator-((Point<double> *)(v1.pos._M_elems + 2),pvVar2,boxcenter);
  pvVar2 = std::array<Parfait::Point<double>,_3UL>::operator[](triverts,1);
  Point<double>::operator-((Point<double> *)(v2.pos._M_elems + 2),pvVar2,boxcenter);
  pvVar2 = std::array<Parfait::Point<double>,_3UL>::operator[](triverts,2);
  Point<double>::operator-((Point<double> *)(e0.pos._M_elems + 2),pvVar2,boxcenter);
  Point<double>::operator-
            ((Point<double> *)(e1.pos._M_elems + 2),(Point<double> *)(v2.pos._M_elems + 2),
             (Point<double> *)(v1.pos._M_elems + 2));
  Point<double>::operator-
            ((Point<double> *)(e2.pos._M_elems + 2),(Point<double> *)(e0.pos._M_elems + 2),
             (Point<double> *)(v2.pos._M_elems + 2));
  Point<double>::operator-
            ((Point<double> *)&fex,(Point<double> *)(v1.pos._M_elems + 2),
             (Point<double> *)(e0.pos._M_elems + 2));
  pdVar3 = Point<double>::operator[]((Point<double> *)(e1.pos._M_elems + 2),0);
  fey = ABS(*pdVar3);
  pdVar3 = Point<double>::operator[]((Point<double> *)(e1.pos._M_elems + 2),1);
  fez = ABS(*pdVar3);
  pdVar3 = Point<double>::operator[]((Point<double> *)(e1.pos._M_elems + 2),2);
  dStack_d8 = ABS(*pdVar3);
  pdVar3 = Point<double>::operator[]((Point<double> *)(e1.pos._M_elems + 2),2);
  dVar4 = *pdVar3;
  pdVar3 = Point<double>::operator[]((Point<double> *)(e1.pos._M_elems + 2),1);
  bVar1 = AXISTEST_X(dVar4,*pdVar3,dStack_d8,fez,(Point<double> *)(v1.pos._M_elems + 2),
                     (Point<double> *)(e0.pos._M_elems + 2),boxhalfsize);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    pdVar3 = Point<double>::operator[]((Point<double> *)(e1.pos._M_elems + 2),2);
    dVar4 = *pdVar3;
    pdVar3 = Point<double>::operator[]((Point<double> *)(e1.pos._M_elems + 2),0);
    bVar1 = AXISTEST_Y(dVar4,*pdVar3,dStack_d8,fey,(Point<double> *)(v1.pos._M_elems + 2),
                       (Point<double> *)(e0.pos._M_elems + 2),boxhalfsize);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      pdVar3 = Point<double>::operator[]((Point<double> *)(e1.pos._M_elems + 2),1);
      dVar4 = *pdVar3;
      pdVar3 = Point<double>::operator[]((Point<double> *)(e1.pos._M_elems + 2),0);
      bVar1 = AXISTEST_Z(dVar4,*pdVar3,fez,fey,(Point<double> *)(v2.pos._M_elems + 2),
                         (Point<double> *)(e0.pos._M_elems + 2),boxhalfsize);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        pdVar3 = Point<double>::operator[]((Point<double> *)(e2.pos._M_elems + 2),0);
        fey = ABS(*pdVar3);
        pdVar3 = Point<double>::operator[]((Point<double> *)(e2.pos._M_elems + 2),1);
        fez = ABS(*pdVar3);
        pdVar3 = Point<double>::operator[]((Point<double> *)(e2.pos._M_elems + 2),2);
        dStack_d8 = ABS(*pdVar3);
        pdVar3 = Point<double>::operator[]((Point<double> *)(e2.pos._M_elems + 2),2);
        dVar4 = *pdVar3;
        pdVar3 = Point<double>::operator[]((Point<double> *)(e2.pos._M_elems + 2),1);
        bVar1 = AXISTEST_X(dVar4,*pdVar3,dStack_d8,fez,(Point<double> *)(v1.pos._M_elems + 2),
                           (Point<double> *)(e0.pos._M_elems + 2),boxhalfsize);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          pdVar3 = Point<double>::operator[]((Point<double> *)(e2.pos._M_elems + 2),2);
          dVar4 = *pdVar3;
          pdVar3 = Point<double>::operator[]((Point<double> *)(e2.pos._M_elems + 2),0);
          bVar1 = AXISTEST_Y(dVar4,*pdVar3,dStack_d8,fey,(Point<double> *)(v1.pos._M_elems + 2),
                             (Point<double> *)(e0.pos._M_elems + 2),boxhalfsize);
          if (bVar1) {
            this_local._7_1_ = false;
          }
          else {
            pdVar3 = Point<double>::operator[]((Point<double> *)(e2.pos._M_elems + 2),1);
            dVar4 = *pdVar3;
            pdVar3 = Point<double>::operator[]((Point<double> *)(e2.pos._M_elems + 2),0);
            bVar1 = AXISTEST_Z(dVar4,*pdVar3,fez,fey,(Point<double> *)(v1.pos._M_elems + 2),
                               (Point<double> *)(v2.pos._M_elems + 2),boxhalfsize);
            if (bVar1) {
              this_local._7_1_ = false;
            }
            else {
              pdVar3 = Point<double>::operator[]((Point<double> *)&fex,0);
              fey = ABS(*pdVar3);
              pdVar3 = Point<double>::operator[]((Point<double> *)&fex,1);
              fez = ABS(*pdVar3);
              pdVar3 = Point<double>::operator[]((Point<double> *)&fex,2);
              dStack_d8 = ABS(*pdVar3);
              pdVar3 = Point<double>::operator[]((Point<double> *)&fex,2);
              dVar4 = *pdVar3;
              pdVar3 = Point<double>::operator[]((Point<double> *)&fex,1);
              bVar1 = AXISTEST_X(dVar4,*pdVar3,dStack_d8,fez,(Point<double> *)(v1.pos._M_elems + 2),
                                 (Point<double> *)(v2.pos._M_elems + 2),boxhalfsize);
              if (bVar1) {
                this_local._7_1_ = false;
              }
              else {
                pdVar3 = Point<double>::operator[]((Point<double> *)&fex,2);
                dVar4 = *pdVar3;
                pdVar3 = Point<double>::operator[]((Point<double> *)&fex,0);
                bVar1 = AXISTEST_Y(dVar4,*pdVar3,dStack_d8,fey,
                                   (Point<double> *)(v1.pos._M_elems + 2),
                                   (Point<double> *)(v2.pos._M_elems + 2),boxhalfsize);
                if (bVar1) {
                  this_local._7_1_ = false;
                }
                else {
                  pdVar3 = Point<double>::operator[]((Point<double> *)&fex,1);
                  dVar4 = *pdVar3;
                  pdVar3 = Point<double>::operator[]((Point<double> *)&fex,0);
                  bVar1 = AXISTEST_Z(dVar4,*pdVar3,fez,fey,(Point<double> *)(v2.pos._M_elems + 2),
                                     (Point<double> *)(e0.pos._M_elems + 2),boxhalfsize);
                  if (bVar1) {
                    this_local._7_1_ = false;
                  }
                  else {
                    for (min._4_4_ = 0; min._4_4_ < 3; min._4_4_ = min._4_4_ + 1) {
                      pdVar3 = Point<double>::operator[]
                                         ((Point<double> *)(v1.pos._M_elems + 2),min._4_4_);
                      dVar4 = *pdVar3;
                      pdVar3 = Point<double>::operator[]
                                         ((Point<double> *)(v2.pos._M_elems + 2),min._4_4_);
                      b = *pdVar3;
                      pdVar3 = Point<double>::operator[]
                                         ((Point<double> *)(e0.pos._M_elems + 2),min._4_4_);
                      pVar5 = findMinMax(dVar4,b,*pdVar3);
                      local_100.first = pVar5.first;
                      local_100.second = pVar5.second;
                      std::tie<double,double>(normal.pos._M_elems + 2,&max);
                      std::tuple<double&,double&>::operator=
                                ((tuple<double&,double&> *)(normal.pos._M_elems + 2),&local_100);
                      dVar4 = max - 1e-10;
                      pdVar3 = Point<double>::operator[](boxhalfsize,min._4_4_);
                      if ((*pdVar3 <= dVar4 && dVar4 != *pdVar3) ||
                         (dVar4 = local_f0 + 1e-10,
                         pdVar3 = Point<double>::operator[](boxhalfsize,min._4_4_), dVar4 < -*pdVar3
                         )) {
                        return false;
                      }
                    }
                    Point<double>::cross
                              ((Point<double> *)local_128,(Point<double> *)(e1.pos._M_elems + 2),
                               (Point<double> *)(e2.pos._M_elems + 2));
                    this_local._7_1_ =
                         planeBoxOverlap((Point<double> *)local_128,
                                         (Point<double> *)(v1.pos._M_elems + 2),boxhalfsize);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool Parfait::Facet::triBoxOverlap(
    const Parfait::Point<double>& boxcenter,
    const Parfait::Point<double>& boxhalfsize,
    const std::array<Parfait::Point<double>,3>& triverts) const {

    auto v0 = triverts[0] - boxcenter;
    auto v1 = triverts[1] - boxcenter;
    auto v2 = triverts[2] - boxcenter;

    auto e0 = v1 - v0;
    auto e1 = v2 - v1;
    auto e2 = v0 - v2;

    auto fex = fabs(e0[0]);
    auto fey = fabs(e0[1]);
    auto fez = fabs(e0[2]);
    if(AXISTEST_X(e0[2], e0[1], fez, fey, v0, v2, boxhalfsize)) return false;
    if(AXISTEST_Y(e0[2], e0[0], fez, fex, v0, v2, boxhalfsize)) return false;
    if(AXISTEST_Z(e0[1], e0[0], fey, fex, v1, v2, boxhalfsize)) return false;

    fex = fabs(e1[0]);
    fey = fabs(e1[1]);
    fez = fabs(e1[2]);
    if(AXISTEST_X(e1[2], e1[1], fez, fey, v0, v2, boxhalfsize)) return false;
    if(AXISTEST_Y(e1[2], e1[0], fez, fex, v0, v2, boxhalfsize)) return false;
    if(AXISTEST_Z(e1[1], e1[0], fey, fex, v0, v1, boxhalfsize)) return false;

    fex = fabs(e2[0]);
    fey = fabs(e2[1]);
    fez = fabs(e2[2]);
    if(AXISTEST_X(e2[2], e2[1], fez, fey, v0, v1, boxhalfsize)) return false;
    if(AXISTEST_Y(e2[2], e2[0], fez, fex, v0, v1, boxhalfsize)) return false;
    if(AXISTEST_Z(e2[1], e2[0], fey, fex, v1, v2, boxhalfsize)) return false;

    for(int i = 0; i < 3; i++) {
        double min, max;
        std::tie(min, max) = findMinMax(v0[i], v1[i], v2[i]);
        if (min - TOL > boxhalfsize[i] || max + TOL < -boxhalfsize[i]) return false;
    }
    auto normal = Parfait::Point<double>::cross(e0, e1);
    return planeBoxOverlap(normal, v0, boxhalfsize);
}